

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer_shaders.h
# Opt level: O0

char * openglrenderer_fsh_texture_bgra(void)

{
  return 
  "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; varying highp vec2 vT; void main() { gl_FragColor = texture2D(t, vT).zyxw; }"
  ;
}

Assistant:

inline const char *openglrenderer_fsh_texture_bgra() { return RENGINE_GLSL(
    uniform lowp sampler2D t;
    varying highp vec2 vT;
    void main() {
        gl_FragColor = texture2D(t, vT).zyxw;
    }
); }